

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::utils::
Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::deepCopy(Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,AbstractRegistry<el::Logger,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
                 *sr)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Logger *this_00;
  _Rb_tree_node_base *p_Var2;
  
  iVar1 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[7])(sr);
  p_Var2 = (_Rb_tree_node_base *)CONCAT44(extraout_var,iVar1);
  while( true ) {
    iVar1 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[8])(sr);
    if (p_Var2 == (_Rb_tree_node_base *)CONCAT44(extraout_var_00,iVar1)) break;
    this_00 = (Logger *)operator_new(0x288);
    Logger::Logger(this_00,*(Logger **)(p_Var2 + 2));
    (*(this->
      super_AbstractRegistry<el::Logger,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
      ).super_ThreadSafe._vptr_ThreadSafe[0xf])(this,p_Var2 + 1,this_00);
    p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2);
  }
  return;
}

Assistant:

virtual void deepCopy(const AbstractRegistry<T_Ptr, std::map<T_Key, T_Ptr*>>& sr) ELPP_FINAL {
    for (const_iterator it = sr.cbegin(); it != sr.cend(); ++it) {
      registerNew(it->first, new T_Ptr(*it->second));
    }
  }